

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_helper.cpp
# Opt level: O0

string * __thiscall
duckdb::TestResultHelper::SQLLogicTestConvertValue_abi_cxx11_
          (TestResultHelper *this,Value *value,LogicalType *sql_type,bool original_sqlite_test)

{
  bool bVar1;
  LogicalTypeId LVar2;
  type pCVar3;
  ulong uVar4;
  LogicalType *in_RCX;
  Value *in_RDX;
  string *in_RDI;
  byte in_R8B;
  string str;
  shared_ptr<duckdb::ClientContext,_true> *in_stack_fffffffffffffe00;
  allocator *paVar5;
  char *local_1d0;
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [32];
  string local_138 [32];
  undefined4 local_118;
  allocator local_111;
  LogicalType local_110 [24];
  ClientContext local_f8 [64];
  string local_b8 [39];
  allocator local_91;
  LogicalType local_90 [24];
  ClientContext local_78 [86];
  allocator local_22;
  byte local_21;
  
  local_21 = in_R8B & 1;
  bVar1 = Value::IsNull(in_RDX);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"NULL",&local_22);
    std::allocator<char>::~allocator((allocator<char> *)&local_22);
  }
  else if (((local_21 & 1) == 0) || (LVar2 = LogicalType::id(in_RCX), 2 < (byte)(LVar2 - DECIMAL)))
  {
    LVar2 = LogicalType::id(in_RCX);
    if (LVar2 == BOOLEAN) {
      uVar4 = duckdb::BooleanValue::Get(in_RDX);
      if ((uVar4 & 1) == 0) {
        local_1d0 = "0";
      }
      else {
        local_1d0 = "1";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,local_1d0,&local_91);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
    }
    else {
      unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::operator->
                ((unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true> *)
                 in_stack_fffffffffffffe00);
      pCVar3 = shared_ptr<duckdb::ClientContext,_true>::operator*(in_stack_fffffffffffffe00);
      duckdb::LogicalType::LogicalType(local_110,VARCHAR);
      duckdb::Value::CastAs(local_f8,(LogicalType *)in_RDX,SUB81(pCVar3,0));
      duckdb::Value::ToString_abi_cxx11_();
      duckdb::Value::~Value((Value *)local_f8);
      duckdb::LogicalType::~LogicalType(local_110);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        std::__cxx11::string::string(local_138,local_b8);
        paVar5 = &local_159;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_158,"",1,paVar5);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_180,"\\0",&local_181);
        duckdb::StringUtil::Replace(in_RDI,local_138,local_158,local_180);
        std::__cxx11::string::~string(local_180);
        std::allocator<char>::~allocator((allocator<char> *)&local_181);
        std::__cxx11::string::~string(local_158);
        std::allocator<char>::~allocator((allocator<char> *)&local_159);
        std::__cxx11::string::~string(local_138);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)in_RDI,"(empty)",&local_111);
        std::allocator<char>::~allocator((allocator<char> *)&local_111);
      }
      local_118 = 1;
      std::__cxx11::string::~string(local_b8);
    }
  }
  else {
    unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::operator->
              ((unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true> *)
               in_stack_fffffffffffffe00);
    pCVar3 = shared_ptr<duckdb::ClientContext,_true>::operator*(in_stack_fffffffffffffe00);
    duckdb::LogicalType::LogicalType(local_90,BIGINT);
    duckdb::Value::CastAs(local_78,(LogicalType *)in_RDX,SUB81(pCVar3,0));
    duckdb::Value::ToString_abi_cxx11_();
    duckdb::Value::~Value((Value *)local_78);
    duckdb::LogicalType::~LogicalType(local_90);
  }
  return in_RDI;
}

Assistant:

string TestResultHelper::SQLLogicTestConvertValue(Value value, LogicalType sql_type, bool original_sqlite_test) {
	if (value.IsNull()) {
		return "NULL";
	} else {
		if (original_sqlite_test) {
			// sqlite test hashes want us to convert floating point numbers to integers
			switch (sql_type.id()) {
			case LogicalTypeId::DECIMAL:
			case LogicalTypeId::FLOAT:
			case LogicalTypeId::DOUBLE:
				return value.CastAs(*runner.con->context, LogicalType::BIGINT).ToString();
			default:
				break;
			}
		}
		switch (sql_type.id()) {
		case LogicalTypeId::BOOLEAN:
			return BooleanValue::Get(value) ? "1" : "0";
		default: {
			string str = value.CastAs(*runner.con->context, LogicalType::VARCHAR).ToString();
			if (str.empty()) {
				return "(empty)";
			} else {
				return StringUtil::Replace(str, string("\0", 1), "\\0");
			}
		}
		}
	}
}